

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::contextMenuEvent(QGraphicsView *this,QContextMenuEvent *event)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  QPoint *pQVar3;
  QObject *pQVar4;
  QPoint *in_RSI;
  QGraphicsView *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsSceneContextMenuEvent contextEvent;
  undefined4 in_stack_ffffffffffffff98;
  Reason in_stack_ffffffffffffff9c;
  QGraphicsSceneEvent *in_stack_ffffffffffffffa0;
  QFlagsStorage<Qt::KeyboardModifier> modifiers;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QGraphicsView *this_00;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QGraphicsView *)0xa3cd3f);
  modifiers.i = (Int)((ulong)in_RDI >> 0x20);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3cd55);
  if ((bVar1) && ((*(uint *)&pQVar2->field_0x300 & 1) != 0)) {
    pQVar3 = QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
    pQVar2->mousePressViewPoint = *pQVar3;
    local_18 = mapToScene(this_00,in_RSI);
    (pQVar2->mousePressScenePoint).xp = local_18.xp;
    (pQVar2->mousePressScenePoint).yp = local_18.yp;
    pQVar3 = QContextMenuEvent::globalPos((QContextMenuEvent *)in_RSI);
    pQVar2->mousePressScreenPoint = *pQVar3;
    (pQVar2->lastMouseMoveScenePoint).xp = (pQVar2->mousePressScenePoint).xp;
    (pQVar2->lastMouseMoveScenePoint).yp = (pQVar2->mousePressScenePoint).yp;
    pQVar2->lastMouseMoveScreenPoint = pQVar2->mousePressScreenPoint;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent
              ((QGraphicsSceneContextMenuEvent *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),modifiers.i);
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffffa0);
    QGraphicsSceneEvent::setWidget
              (in_stack_ffffffffffffffa0,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QGraphicsSceneContextMenuEvent::setScenePos
              ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffffa0,
               (QPointF *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QGraphicsSceneContextMenuEvent::setScreenPos
              ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffffa0,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QInputEvent::modifiers((QInputEvent *)in_stack_ffffffffffffffa0);
    QGraphicsSceneContextMenuEvent::setModifiers
              ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffffa0,
               (KeyboardModifiers)modifiers.i);
    QContextMenuEvent::reason((QContextMenuEvent *)in_RSI);
    QGraphicsSceneContextMenuEvent::setReason
              ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c
              );
    bVar1 = QEvent::isAccepted((QEvent *)in_RSI);
    QEvent::setAccepted((QEvent *)&local_30,bVar1);
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QGraphicsSceneEvent::setTimestamp
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pQVar4 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3cf12)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar4,(QEvent *)&local_30);
    bVar1 = QEvent::isAccepted((QEvent *)&local_30);
    (**(code **)((long)*in_RSI + 0x10))(in_RSI,bVar1);
    QGraphicsSceneContextMenuEvent::~QGraphicsSceneContextMenuEvent
              ((QGraphicsSceneContextMenuEvent *)0xa3cf53);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::contextMenuEvent(QContextMenuEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    d->mousePressViewPoint = event->pos();
    d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
    d->mousePressScreenPoint = event->globalPos();
    d->lastMouseMoveScenePoint = d->mousePressScenePoint;
    d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;

    QGraphicsSceneContextMenuEvent contextEvent(QEvent::GraphicsSceneContextMenu);
    contextEvent.setWidget(viewport());
    contextEvent.setScenePos(d->mousePressScenePoint);
    contextEvent.setScreenPos(d->mousePressScreenPoint);
    contextEvent.setModifiers(event->modifiers());
    contextEvent.setReason((QGraphicsSceneContextMenuEvent::Reason)(event->reason()));
    contextEvent.setAccepted(event->isAccepted());
    contextEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(d->scene, &contextEvent);
    event->setAccepted(contextEvent.isAccepted());
}